

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

void envy_bios_print_power_unk24(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (bios->power).unk24.offset;
  if ((mask >> 10 & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar2 = (ulong)(bios->power).unk24.version;
  if ((bios->power).unk24.valid != '\0') {
    fprintf((FILE *)out,"VENTURA table at 0x%x, version %x\n",(ulong)uVar1,uVar2);
    envy_bios_dump_hex(bios,out,(bios->power).unk24.offset,(uint)(bios->power).unk24.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    if ((bios->power).unk24.entriesnum != '\0') {
      uVar2 = 0;
      do {
        envy_bios_dump_hex(bios,out,(bios->power).unk24.entries[uVar2].offset,
                           (uint)(bios->power).unk24.rlen,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < (bios->power).unk24.entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse VENTURA table at 0x%x, version %x\n",(ulong)uVar1,uVar2);
  return;
}

Assistant:

void envy_bios_print_power_unk24(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk24 *unk24 = &bios->power.unk24;
	int i;

	if (!unk24->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk24->valid) {
		fprintf(out, "Failed to parse VENTURA table at 0x%x, version %x\n", unk24->offset, unk24->version);
		return;
	}

	fprintf(out, "VENTURA table at 0x%x, version %x\n", unk24->offset, unk24->version);
	envy_bios_dump_hex(bios, out, unk24->offset, unk24->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk24->entriesnum; i++) {
		envy_bios_dump_hex(bios, out, unk24->entries[i].offset, unk24->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}